

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int read_char_literal(int pass,char delim)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  char *message;
  
  pcVar1 = lineptr + 1;
  cVar2 = *lineptr;
  iVar4 = (int)cVar2;
  ecolumn = column + 1;
  if (cVar2 == '\0') {
    ecolumn = column;
    message = "unterminated character or string literal";
    iVar4 = 0;
  }
  else {
    if (cVar2 != delim) {
      if (cVar2 != '\\') {
        column = ecolumn;
        lineptr = pcVar1;
        return iVar4;
      }
      pcVar1 = lineptr + 2;
      bVar3 = lineptr[1];
      column = column + 2;
      if (bVar3 < 0x5c) {
        if (bVar3 == 0x22) {
          lineptr = pcVar1;
          ecolumn = column;
          return 0x22;
        }
        if (bVar3 == 0x27) {
          lineptr = pcVar1;
          ecolumn = column;
          return 0x27;
        }
        if (bVar3 == 0x3f) {
          lineptr = pcVar1;
          ecolumn = column;
          return 0x3f;
        }
      }
      else {
        switch(bVar3) {
        case 0x5c:
          lineptr = pcVar1;
          ecolumn = column;
          return 0x5c;
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 99:
        case 100:
          break;
        case 0x61:
          lineptr = pcVar1;
          ecolumn = column;
          return 7;
        case 0x62:
          lineptr = pcVar1;
          ecolumn = column;
          return 8;
        case 0x65:
          lineptr = pcVar1;
          ecolumn = column;
          return 0x1b;
        case 0x66:
          lineptr = pcVar1;
          ecolumn = column;
          return 0xc;
        default:
          switch(bVar3) {
          case 0x6e:
            lineptr = pcVar1;
            ecolumn = column;
            return 10;
          case 0x72:
            lineptr = pcVar1;
            ecolumn = column;
            return 0xd;
          case 0x74:
            lineptr = pcVar1;
            ecolumn = column;
            return 9;
          case 0x76:
            lineptr = pcVar1;
            ecolumn = column;
            return 0xb;
          }
        }
      }
      uVar5 = (uint)(char)bVar3;
      if (pass != 1) {
        lineptr = pcVar1;
        ecolumn = column;
        return uVar5;
      }
      lineptr = pcVar1;
      ecolumn = column;
      err(W,"unknown escape sequence \'\\%c\'",(ulong)uVar5);
      return uVar5;
    }
    if (delim != '\'') {
      column = ecolumn;
      lineptr = pcVar1;
      return iVar4;
    }
    message = "empty character literal";
    lineptr = pcVar1;
  }
  column = ecolumn;
  err(E,message);
  return iVar4;
}

Assistant:

int read_char_literal(int pass, char delim)
{
    int c = *lineptr++;
    ecolumn = ++column;
    if (!c)
    {
        --lineptr;
        ecolumn = --column;
        err(E, "unterminated character or string literal");
        return c;
    }
    if (c == delim)
    {
        if (delim == '\'')
            err(E, "empty character literal");
        return c;
    }

    if (c == '\\')
    {
        c = *lineptr++;
        ecolumn = ++column;
        switch (c)
        {
            case 'a': c = '\a'; break;
            case 'b': c = '\b'; break;
            case 'e': c = '\e'; break;
            case 'f': c = '\f'; break;
            case 'n': c = '\n'; break;
            case 'r': c = '\r'; break;
            case 't': c = '\t'; break;
            case 'v': c = '\v'; break;
            case '\\': c = '\\'; break;
            case '\'': c = '\''; break;
            case '\"': c = '\"'; break;
            case '\?': c = '\?'; break;
            default:
                if (pass == READ_PASS)
                    err(W, "unknown escape sequence \'\\%c\'", c);
        }
    }
    return c;
}